

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_shared_ptr.cpp
# Opt level: O3

void __thiscall Fixture_ctr_strong_from_weak::testCase(Fixture_ctr_strong_from_weak *this)

{
  int iVar1;
  shared_ptr<TestSharedPtrObj> ptr;
  shared_ptr<TestSharedPtrObj> sStack_18;
  
  rcc::shared_ptr<TestSharedPtrObj>::shared_ptr(&sStack_18,&(this->super_Fixture).weak);
  iVar1 = IObjectSharedState::ObjectCount((this->super_Fixture).state);
  if (iVar1 != (this->super_Fixture).start_obj_count + 1) {
    __assert_fail("state->ObjectCount() == start_obj_count + 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/dtmoodie[P]RuntimeCompiledCPlusPlus/Aurora/tests/test_shared_ptr.cpp"
                  ,0x2f,"void Fixture_ctr_strong_from_weak::testCase()");
  }
  iVar1 = IObjectSharedState::StateCount((this->super_Fixture).state);
  if (iVar1 == (this->super_Fixture).start_state_count + 1) {
    rcc::shared_ptr<TestSharedPtrObj>::~shared_ptr(&sStack_18);
    return;
  }
  __assert_fail("state->StateCount() == start_state_count + 1",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/dtmoodie[P]RuntimeCompiledCPlusPlus/Aurora/tests/test_shared_ptr.cpp"
                ,0x30,"void Fixture_ctr_strong_from_weak::testCase()");
}

Assistant:

TEST_CASE(ctr_strong_from_weak){
    rcc::shared_ptr<TestSharedPtrObj> ptr(weak);
    assert(state->ObjectCount() == start_obj_count + 1);
    assert(state->StateCount() == start_state_count + 1);
}